

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleRowDown4_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    dst[lVar1] = src_ptr[lVar1 * 4 + 2];
    dst[lVar1 + 1] = src_ptr[lVar1 * 4 + 6];
  }
  if ((dst_width & 1U) != 0) {
    dst[lVar1] = src_ptr[lVar1 * 4 + 2];
  }
  return;
}

Assistant:

void ScaleRowDown4_16_C(const uint16_t* src_ptr,
                        ptrdiff_t src_stride,
                        uint16_t* dst,
                        int dst_width) {
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src_ptr[2];
    dst[1] = src_ptr[6];
    dst += 2;
    src_ptr += 8;
  }
  if (dst_width & 1) {
    dst[0] = src_ptr[2];
  }
}